

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

void __thiscall
pbrt::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,StatsAccumulator *accum)

{
  long *in_FS_OFFSET;
  int64_t in_stack_00000040;
  char *in_stack_00000048;
  StatsAccumulator *in_stack_00000050;
  
  StatsAccumulator::ReportCounter(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  *(undefined8 *)(*in_FS_OFFSET + -0x478) = 0;
  return;
}

Assistant:

std::string ToString(CurveType type) {
    switch (type) {
    case CurveType::Flat:
        return "Flat";
    case CurveType::Cylinder:
        return "Cylinder";
    case CurveType::Ribbon:
        return "Ribbon";
    default:
        LOG_FATAL("Unhandled case");
        return "";
    }
}